

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BST.hpp
# Opt level: O0

unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
 __thiscall
supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>::createLikeThis
          (BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long> *this)

{
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
  *in_RSI;
  _Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_*,_false>
  in_RDI;
  unique_ptr<supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::make_unique<supermap::BST<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long>>();
  std::
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long>,std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long>>>
  ::
  unique_ptr<supermap::BST<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long>,std::default_delete<supermap::BST<supermap::Key<3ul>,supermap::ByteArray<4ul>,unsigned_long>>,void>
            (in_RSI,in_stack_ffffffffffffffe8);
  std::
  unique_ptr<supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::BST<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
                 *)in_RDI._M_head_impl);
  return (__uniq_ptr_data<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>,_true,_true>
          )(tuple<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<3UL>,_supermap::ByteArray<4UL>,_unsigned_long>_>_>
            )in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<ExtractibleKeyValueStorage<Key, Value, IndexT>> createLikeThis() const override {
        return std::make_unique<BST<Key, Value, IndexT>>();
    }